

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManReader.cpp
# Opt level: O2

vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
* __thiscall
adios2::core::engine::DataManReader::DoBlocksInfo
          (vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
           *__return_storage_ptr__,DataManReader *this,Variable<long> *variable,size_t step)

{
  BlocksInfoCommon<long>(__return_storage_ptr__,this,variable,step);
  return __return_storage_ptr__;
}

Assistant:

void DataManReader::DoClose(const int transportIndex)
{
    m_SubscriberThreadActive = false;
    m_RequesterThreadActive = false;
    if (m_SubscriberThread.joinable())
    {
        m_SubscriberThread.join();
    }
    if (m_RequesterThread.joinable())
    {
        m_RequesterThread.join();
    }
    m_IsClosed = true;
    if (m_MonitorActive)
    {
        m_Monitor.OutputCsv(m_Name);
        m_Monitor.OutputJson(m_Name);
    }
}